

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cppcms::json::value::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,value *this,char *path,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  pointer pcVar1;
  char cVar2;
  long *plVar3;
  
  cppcms::json::value::find((char *)this);
  cVar2 = cppcms::json::value::is_undefined();
  if (cVar2 == '\0') {
    plVar3 = (long *)cppcms::json::value::str_abi_cxx11_();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar3,plVar3[1] + *plVar3);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (def->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + def->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

T get(char const *path,T const &def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<T>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}